

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier_test.cpp
# Opt level: O0

void __thiscall BarrierTest_Ctor_Test::TestBody(BarrierTest_Ctor_Test *this)

{
  bool bVar1;
  char *message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  AssertHelper local_f8;
  Message local_f0 [6];
  exception *e;
  barrier<yamc::detail::default_barrier_completion> local_b8;
  undefined1 auStack_38 [8];
  TrueWithString gtest_msg;
  BarrierTest_Ctor_Test *this_local;
  
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  auStack_38 = (undefined1  [8])0x0;
  gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_38);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_38);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      yamc::barrier<yamc::detail::default_barrier_completion>::barrier(&local_b8,1);
      yamc::barrier<yamc::detail::default_barrier_completion>::~barrier(&local_b8);
    }
  }
  else {
    testing::Message::Message(local_f0);
    std::operator+(&local_118,
                   "Expected: yamc::barrier<>{1} doesn\'t throw an exception.\n  Actual: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_38);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/barrier_test.cpp"
               ,0x22,message);
    testing::internal::AssertHelper::operator=(&local_f8,local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    testing::Message::~Message(local_f0);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_38);
  return;
}

Assistant:

TEST(BarrierTest, Ctor)
{
  EXPECT_NO_THROW(yamc::barrier<>{1});
}